

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[40]>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [40])

{
  undefined4 in_register_00000014;
  char argValues [1] [7];
  
  str<char_const(&)[40]>
            ((String *)argValues,(kj *)params,(char (*) [40])CONCAT44(in_register_00000014,severity)
            );
  logInternal((Debug *)file,(char *)(ulong)line._0_4_,severity,(LogSeverity)macroArgs,argValues[0],
              _argValues);
  Array<char>::~Array((Array<char> *)argValues);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}